

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicy.cpp
# Opt level: O2

uint8_t __thiscall
GmmLib::GmmGen12CachePolicy::SelectNewPATIdx
          (GmmGen12CachePolicy *this,GMM_GFX_MEMORY_TYPE WantedMT,GMM_GFX_MEMORY_TYPE MT1,
          GMM_GFX_MEMORY_TYPE MT2)

{
  return (MT2 == GMM_GFX_UC_WITH_FENCE || MT2 == WantedMT) && MT1 != WantedMT;
}

Assistant:

uint8_t GmmLib::GmmGen12CachePolicy::SelectNewPATIdx(GMM_GFX_MEMORY_TYPE WantedMT,
                                                     GMM_GFX_MEMORY_TYPE MT1, GMM_GFX_MEMORY_TYPE MT2)
{
    uint8_t SelectPAT2 = 0;

    // select on Memory Type
    if(MT1 != WantedMT)
    {
        if(MT2 == WantedMT || MT2 == GMM_GFX_UC_WITH_FENCE)
        {
            SelectPAT2 = 1;
        }
        goto EXIT;
    }

EXIT:
    return SelectPAT2;
}